

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

int __thiscall cmXMLParser::ParseBuffer(cmXMLParser *this,char *buffer,size_type count)

{
  int iVar1;
  size_type count_local;
  char *buffer_local;
  cmXMLParser *this_local;
  
  iVar1 = cm_expat_XML_Parse(this->Parser,buffer,(int)count,0);
  if (iVar1 == 0) {
    (*this->_vptr_cmXMLParser[0xb])();
  }
  this_local._4_4_ = (uint)(iVar1 != 0);
  return this_local._4_4_;
}

Assistant:

int cmXMLParser::ParseBuffer(const char* buffer, std::string::size_type count)
{
  // Pass the buffer to the expat XML parser.
  if(!XML_Parse(static_cast<XML_Parser>(this->Parser), buffer,
                static_cast<int>(count), 0))
    {
    this->ReportXmlParseError();
    return 0;
    }
  return 1;
}